

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::groebnerRow28_00000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  lVar16 = (long)targetRow;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0x9f8];
  auVar15._8_8_ = 0x8000000000000000;
  auVar15._0_8_ = 0x8000000000000000;
  auVar17 = vxorpd_avx512vl(auVar18,auVar15);
  auVar19._0_8_ =
       auVar17._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa14];
  auVar19._8_8_ = auVar17._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0x9f8] = 0.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb48];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xb2c];
  auVar17 = vfmadd213sd_fma(auVar20,auVar19,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xb2c] = auVar17._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb74];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xb58];
  auVar17 = vfmadd213sd_fma(auVar21,auVar19,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xb58] = auVar17._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xba0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xb84];
  auVar17 = vfmadd213sd_fma(auVar22,auVar19,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xb84] = auVar17._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbcc];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xbb0];
  auVar17 = vfmadd213sd_fma(auVar23,auVar19,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xbb0] = auVar17._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbf8];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xbdc];
  auVar17 = vfmadd213sd_fma(auVar24,auVar19,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xbdc] = auVar17._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc24];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xc08];
  auVar17 = vfmadd213sd_fma(auVar25,auVar19,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xc08] = auVar17._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc50];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xc34];
  auVar17 = vfmadd213sd_fma(auVar26,auVar19,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xc34] = auVar17._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc7c];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xc60];
  auVar17 = vfmadd213sd_fma(auVar27,auVar19,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xc60] = auVar17._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xca8];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xc8c];
  auVar17 = vfmadd213sd_fma(auVar28,auVar19,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xc8c] = auVar17._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcd4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar16 + 0xcb8];
  auVar17 = vfmadd213sd_fma(auVar29,auVar19,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xcb8] = auVar17._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd00];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xce4];
  auVar17 = vfmadd213sd_fma(auVar30,auVar19,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xce4] = auVar17._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd2c];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xd10];
  auVar17 = vfmadd213sd_fma(auVar31,auVar19,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xd10] = auVar17._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd58];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xd3c];
  auVar17 = vfmadd213sd_fma(auVar32,auVar19,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xd3c] = auVar17._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd84];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xd68];
  auVar17 = vfmadd213sd_fma(auVar33,auVar19,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xd68] = auVar17._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xdb0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar16 + 0xd94];
  auVar17 = vfmadd213sd_fma(auVar34,auVar19,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar16 + 0xd94] = auVar17._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow28_00000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,58) / groebnerMatrix(28,58);
  groebnerMatrix(targetRow,58) = 0.0;
  groebnerMatrix(targetRow,65) -= factor * groebnerMatrix(28,65);
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(28,66);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(28,67);
  groebnerMatrix(targetRow,68) -= factor * groebnerMatrix(28,68);
  groebnerMatrix(targetRow,69) -= factor * groebnerMatrix(28,69);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(28,70);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(28,71);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(28,72);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(28,73);
  groebnerMatrix(targetRow,74) -= factor * groebnerMatrix(28,74);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(28,75);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(28,76);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(28,77);
  groebnerMatrix(targetRow,78) -= factor * groebnerMatrix(28,78);
  groebnerMatrix(targetRow,79) -= factor * groebnerMatrix(28,79);
}